

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetItemDefaultFocus(void)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImGuiWindow *pIVar3;
  ImGuiWindow *pIVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  ImGuiContext *g;
  float fVar7;
  float fVar8;
  
  pIVar5 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  if ((((pIVar3->Appearing == true) &&
       (pIVar4 = GImGui->NavWindow, pIVar4 == pIVar3->RootWindowForNav)) &&
      ((GImGui->NavInitRequest != false || (GImGui->NavInitResultId != 0)))) &&
     (GImGui->NavLayer == (pIVar3->DC).NavLayerCurrent)) {
    GImGui->NavInitRequest = false;
    pIVar5->NavInitResultId = (pIVar3->DC).LastItemId;
    IVar1 = (pIVar3->DC).LastItemRect.Min;
    IVar2 = (pIVar3->DC).LastItemRect.Max;
    fVar7 = (pIVar3->Pos).x;
    fVar8 = (pIVar3->Pos).y;
    (pIVar5->NavInitResultRectRel).Min.x = IVar1.x - fVar7;
    (pIVar5->NavInitResultRectRel).Min.y = IVar1.y - fVar8;
    (pIVar5->NavInitResultRectRel).Max.x = IVar2.x - fVar7;
    (pIVar5->NavInitResultRectRel).Max.y = IVar2.y - fVar8;
    if (pIVar5->NavMoveRequest == false) {
      pIVar5->NavAnyRequest = false;
    }
    else {
      pIVar5->NavAnyRequest = true;
      if (pIVar4 == (ImGuiWindow *)0x0) {
        __assert_fail("g.NavWindow != __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                      ,0x22e7,"void ImGui::NavUpdateAnyRequestFlag()");
      }
    }
    bVar6 = IsItemVisible();
    if (!bVar6) {
      SetScrollHereY(0.5);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::SetItemDefaultFocus()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (!window->Appearing)
        return;
    if (g.NavWindow == window->RootWindowForNav && (g.NavInitRequest || g.NavInitResultId != 0) && g.NavLayer == window->DC.NavLayerCurrent)
    {
        g.NavInitRequest = false;
        g.NavInitResultId = window->DC.LastItemId;
        g.NavInitResultRectRel = ImRect(window->DC.LastItemRect.Min - window->Pos, window->DC.LastItemRect.Max - window->Pos);
        NavUpdateAnyRequestFlag();
        if (!IsItemVisible())
            SetScrollHereY();
    }
}